

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O1

void __thiscall wasm::ModuleReader::readText(ModuleReader *this,string *filename,Module *wasm)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  BinaryOption in_ECX;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  long local_38;
  char local_28;
  
  bVar2 = isDebugEnabled("writer");
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"reading text from ",0x12);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  read_file<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (wasm *)filename,(string *)0x1,in_ECX);
  pcVar1 = (filename->_M_dataplus)._M_p;
  input.field_2._8_8_ = &stack0xffffffffffffffc8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&input.field_2 + 8),pcVar1,pcVar1 + filename->_M_string_length);
  local_28 = '\x01';
  readTextData((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&input.field_2 + 8),(string *)local_68,wasm,in_ECX);
  if (local_28 == '\x01') {
    local_28 = '\0';
    if ((long *)input.field_2._8_8_ != &stack0xffffffffffffffc8) {
      operator_delete((void *)input.field_2._8_8_,local_38 + 1);
    }
  }
  if (local_68 != (undefined1  [8])&input._M_string_length) {
    operator_delete((void *)local_68,input._M_string_length + 1);
  }
  return;
}

Assistant:

void ModuleReader::readText(std::string filename, Module& wasm) {
  BYN_TRACE("reading text from " << filename << "\n");
  auto input(read_file<std::string>(filename, Flags::Text));
  readTextData(filename, input, wasm, profile);
}